

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeRepresentation.hpp
# Opt level: O3

Time __thiscall helics::TimeCoordinator::generateAllowedTime(TimeCoordinator *this,Time testTime)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  Time TVar5;
  double dVar6;
  double dVar7;
  
  uVar1 = (this->info).period.internalTimeCode;
  if (1 < (long)uVar1) {
    lVar4 = 0x7fffffffffffffff;
    TVar5.internalTimeCode = lVar4;
    if (testTime.internalTimeCode != 0x7fffffffffffffff) {
      lVar2 = (this->time_grantBase).internalTimeCode;
      TVar5.internalTimeCode = (this->info).offset.internalTimeCode;
      if ((TVar5.internalTimeCode <= lVar2) ||
         (lVar2 = TVar5.internalTimeCode, TVar5.internalTimeCode < testTime.internalTimeCode)) {
        uVar3 = testTime.internalTimeCode - lVar2;
        if ((long)uVar1 < (long)uVar3) {
          dVar7 = (double)((int)uVar1 + (int)(uVar1 / 1000000000) * -1000000000) * 1e-09 +
                  (double)(uVar1 / 1000000000);
          dVar6 = ceil(((double)((int)uVar3 + (int)(uVar3 / 1000000000) * -1000000000) * 1e-09 +
                       (double)(uVar3 / 1000000000)) / dVar7);
          dVar6 = dVar6 * dVar7;
          if (dVar6 <= -9223372036.854765) {
            lVar4 = -0x7fffffffffffffff;
          }
          else if (dVar6 < 9223372036.854765) {
            lVar4 = (long)(dVar6 * 1000000000.0 +
                          *(double *)(&DAT_0040a540 + (ulong)(0.0 <= dVar6 * 1000000000.0) * 8));
          }
          TVar5.internalTimeCode = lVar4 + lVar2;
        }
        else {
          TVar5.internalTimeCode = lVar2 + uVar1;
        }
      }
    }
    return (Time)TVar5.internalTimeCode;
  }
  return (Time)testTime.internalTimeCode;
}

Assistant:

bool operator>(const TimeRepresentation& rhs) const noexcept
    {
        return (internalTimeCode > rhs.internalTimeCode);
    }